

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

ConstPixelBufferAccess *
tcu::flipYAccess(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access)

{
  int iVar1;
  int iVar2;
  int z_;
  TextureFormat *format;
  IVec3 *size;
  void *pvVar3;
  undefined1 local_2c [8];
  IVec3 pitch;
  int offsetToLast;
  int rowPitch;
  ConstPixelBufferAccess *access_local;
  
  iVar1 = ConstPixelBufferAccess::getRowPitch(access);
  pitch.m_data[2] = iVar1;
  iVar2 = ConstPixelBufferAccess::getHeight(access);
  pitch.m_data[1] = iVar1 * (iVar2 + -1);
  iVar2 = ConstPixelBufferAccess::getPixelPitch(access);
  iVar1 = -pitch.m_data[2];
  z_ = ConstPixelBufferAccess::getSlicePitch(access);
  Vector<int,_3>::Vector((Vector<int,_3> *)local_2c,iVar2,iVar1,z_);
  format = ConstPixelBufferAccess::getFormat(access);
  size = ConstPixelBufferAccess::getSize(access);
  pvVar3 = ConstPixelBufferAccess::getDataPtr(access);
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,size,(IVec3 *)local_2c,
             (void *)((long)pvVar3 + (long)pitch.m_data[1]));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess flipYAccess (const ConstPixelBufferAccess& access)
{
	const int			rowPitch		= access.getRowPitch();
	const int			offsetToLast	= rowPitch*(access.getHeight()-1);
	const tcu::IVec3	pitch			(access.getPixelPitch(), -rowPitch, access.getSlicePitch());

	return ConstPixelBufferAccess(access.getFormat(), access.getSize(), pitch, (deUint8*)access.getDataPtr() + offsetToLast);
}